

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeFreeCursor(Vdbe *p,VdbeCursor *pCx)

{
  u8 uVar1;
  BtCursor *pBVar2;
  sqlite3 *psVar3;
  sqlite3_module *pModule;
  sqlite3_vtab_cursor *pVCur;
  VdbeCursor *pCx_local;
  Vdbe *p_local;
  
  if (pCx != (VdbeCursor *)0x0) {
    uVar1 = pCx->eCurType;
    if (uVar1 == '\0') {
      if ((pCx->field_0x5 & 1) == 0) {
        sqlite3BtreeCloseCursor((pCx->uc).pCursor);
      }
      else if (pCx->pBtx != (Btree *)0x0) {
        sqlite3BtreeClose(pCx->pBtx);
      }
    }
    else if (uVar1 == '\x01') {
      sqlite3VdbeSorterClose(p->db,pCx);
    }
    else if (uVar1 == '\x02') {
      pBVar2 = (pCx->uc).pCursor;
      psVar3 = pBVar2->pBtree->db;
      *(int *)&pBVar2->pBtree->pBt = *(int *)&pBVar2->pBtree->pBt + -1;
      (*(code *)psVar3->szMmap)(pBVar2);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursor(Vdbe *p, VdbeCursor *pCx){
  if( pCx==0 ){
    return;
  }
  assert( pCx->pBtx==0 || pCx->eCurType==CURTYPE_BTREE );
  switch( pCx->eCurType ){
    case CURTYPE_SORTER: {
      sqlite3VdbeSorterClose(p->db, pCx);
      break;
    }
    case CURTYPE_BTREE: {
      if( pCx->isEphemeral ){
        if( pCx->pBtx ) sqlite3BtreeClose(pCx->pBtx);
        /* The pCx->pCursor will be close automatically, if it exists, by
        ** the call above. */
      }else{
        assert( pCx->uc.pCursor!=0 );
        sqlite3BtreeCloseCursor(pCx->uc.pCursor);
      }
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case CURTYPE_VTAB: {
      sqlite3_vtab_cursor *pVCur = pCx->uc.pVCur;
      const sqlite3_module *pModule = pVCur->pVtab->pModule;
      assert( pVCur->pVtab->nRef>0 );
      pVCur->pVtab->nRef--;
      pModule->xClose(pVCur);
      break;
    }
#endif
  }
}